

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

CPAccessResult gt_cntfrq_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  uint64_t uVar5;
  uint32_t local_34;
  uint32_t cntkctl;
  uint64_t hcr;
  int el;
  _Bool isread_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  iVar2 = arm_current_el(env);
  if (iVar2 == 0) {
    uVar5 = arm_hcr_el2_eff_aarch64(env);
    if ((uVar5 & 0x408000000) == 0x408000000) {
      local_34 = (env->cp15).cnthctl_el2;
    }
    else {
      local_34 = (uint32_t)(env->cp15).c14_cntkctl;
    }
    uVar3 = extract32(local_34,0,2);
    if (uVar3 == 0) {
      return CP_ACCESS_TRAP;
    }
  }
  else if ((((iVar2 == 1) && (!isread)) && (ri->state == 0)) &&
          (_Var1 = arm_is_secure_below_el3(env), _Var1)) {
    return CP_ACCESS_TRAP_UNCATEGORIZED;
  }
  if ((isread) || (iVar4 = arm_highest_el(env), iVar4 <= iVar2)) {
    env_local._4_4_ = CP_ACCESS_OK;
  }
  else {
    env_local._4_4_ = CP_ACCESS_TRAP_UNCATEGORIZED;
  }
  return env_local._4_4_;
}

Assistant:

static CPAccessResult gt_cntfrq_access(CPUARMState *env, const ARMCPRegInfo *ri,
                                       bool isread)
{
    /* CNTFRQ: not visible from PL0 if both PL0PCTEN and PL0VCTEN are zero.
     * Writable only at the highest implemented exception level.
     */
    int el = arm_current_el(env);
    uint64_t hcr;
    uint32_t cntkctl;

    switch (el) {
    case 0:
        hcr = arm_hcr_el2_eff(env);
        if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
            cntkctl = env->cp15.cnthctl_el2;
        } else {
            cntkctl = env->cp15.c14_cntkctl;
        }
        if (!extract32(cntkctl, 0, 2)) {
            return CP_ACCESS_TRAP;
        }
        break;
    case 1:
        if (!isread && ri->state == ARM_CP_STATE_AA32 &&
            arm_is_secure_below_el3(env)) {
            /* Accesses from 32-bit Secure EL1 UNDEF (*not* trap to EL3!) */
            return CP_ACCESS_TRAP_UNCATEGORIZED;
        }
        break;
    case 2:
    case 3:
        break;
    }

    if (!isread && el < arm_highest_el(env)) {
        return CP_ACCESS_TRAP_UNCATEGORIZED;
    }

    return CP_ACCESS_OK;
}